

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrubberband.cpp
# Opt level: O0

void __thiscall QRubberBand::paintEvent(QRubberBand *this,QPaintEvent *param_2)

{
  QStylePainter *in_RDI;
  long in_FS_OFFSET;
  QStylePainter painter;
  QStyleOptionRubberBand option;
  undefined1 *puVar1;
  ControlElement ce;
  QWidget *in_stack_ffffffffffffff68;
  undefined1 **ppuVar2;
  undefined1 *local_78;
  QWidget *pQStack_70;
  QStyle *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)&local_78,in_stack_ffffffffffffff68);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  ppuVar2 = &local_58;
  local_18 = puVar1;
  QStyleOptionRubberBand::QStyleOptionRubberBand((QStyleOptionRubberBand *)0x678247);
  ce = (ControlElement)((ulong)puVar1 >> 0x20);
  (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,ppuVar2);
  QStylePainter::drawControl(in_RDI,ce,(QStyleOption *)0x678271);
  QStyleOptionRubberBand::~QStyleOptionRubberBand((QStyleOptionRubberBand *)0x67827b);
  QStylePainter::~QStylePainter((QStylePainter *)0x678285);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRubberBand::paintEvent(QPaintEvent *)
{
    QStylePainter painter(this);
    QStyleOptionRubberBand option;
    initStyleOption(&option);
    painter.drawControl(QStyle::CE_RubberBand, option);
}